

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softmax.cpp
# Opt level: O0

int __thiscall ncnn::Softmax::forward_inplace(Softmax *this,Mat *bottom_top_blob,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  Mat *in_RSI;
  long in_RDI;
  double dVar3;
  int j_11;
  int j_10;
  float sum_4;
  int j_9;
  float max_4;
  int i_13;
  float *ptr_11;
  int q_6;
  int channels_2;
  int h_4;
  int w_5;
  int j_8;
  int i_12;
  float *sumptr_1;
  float *ptr_10;
  int q_5;
  int j_7;
  int i_11;
  float *sumptr;
  float *maxptr_1;
  float *ptr_9;
  int q_4;
  Mat sum_3;
  int j_6;
  int i_10;
  float *maxptr;
  float *ptr_8;
  int q_3;
  Mat max_3;
  int channels_1;
  int h_3;
  int w_4;
  int i_9;
  float *ptr_7;
  int q_2;
  int i_8;
  float *ptr_6;
  int q_1;
  Mat sum_2;
  int i_7;
  float *ptr_5;
  int q;
  Mat max_2;
  int size;
  int channels;
  int h_2;
  int w_3;
  int j_5;
  int j_4;
  float s;
  int j_3;
  float m;
  float *ptr_4;
  int i_6;
  int h_1;
  int w_2;
  int j_2;
  float *ptr_3;
  int i_5;
  int j_1;
  float *ptr_2;
  int i_4;
  Mat sum_1;
  int j;
  float *ptr_1;
  int i_3;
  Mat max_1;
  int h;
  int w_1;
  int i_2;
  int i_1;
  float sum;
  int i;
  float max;
  float *ptr;
  int w;
  int positive_axis;
  size_t elemsize;
  int dims;
  Mat *in_stack_fffffffffffff930;
  Mat *this_00;
  Allocator *in_stack_fffffffffffff938;
  float fVar4;
  Mat *in_stack_fffffffffffff940;
  undefined8 in_stack_fffffffffffff948;
  int _w;
  undefined4 in_stack_fffffffffffff950;
  float in_stack_fffffffffffff954;
  Mat *in_stack_fffffffffffff958;
  int local_57c;
  int local_570;
  int local_56c;
  float local_568;
  int local_564;
  float local_560;
  int local_55c;
  Mat local_558;
  float *local_510;
  int local_508;
  int local_504;
  int local_500;
  int local_4fc;
  int local_4f8;
  int local_4f4;
  float *local_4f0;
  Mat local_4e8;
  float *local_4a0;
  int local_494;
  int local_490;
  int local_48c;
  Mat *local_488;
  float *local_480;
  Mat local_478;
  float *local_430;
  int local_424;
  Mat local_420;
  int local_3d8;
  int local_3d4;
  float *local_3d0;
  Mat local_3c8;
  float *local_380;
  int local_374;
  Mat local_370;
  int local_328;
  int local_324;
  int local_320;
  int local_31c;
  Mat local_318;
  float *local_2d0;
  int local_2c8;
  int local_2c4;
  Mat local_2c0;
  float *local_278;
  int local_26c;
  Mat local_268;
  int local_21c;
  Mat local_218;
  float *local_1d0;
  int local_1c4;
  Mat local_1c0;
  int local_174;
  int local_170;
  int local_16c;
  int local_168;
  int local_164;
  int local_160;
  float local_15c;
  int local_158;
  float local_154;
  float *local_150;
  int local_148;
  int local_144;
  int local_140;
  int local_13c;
  float *local_138;
  int local_130;
  int local_12c;
  float *local_128;
  int local_11c;
  Mat local_118;
  int local_cc;
  float *local_c8;
  int local_bc;
  undefined4 local_b8;
  Mat local_a8;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  float local_4c;
  int local_48;
  float local_44;
  float *local_40;
  int local_38;
  int local_34;
  size_t local_30;
  int local_24;
  Mat *local_18;
  int local_4;
  
  local_24 = in_RSI->dims;
  local_30 = in_RSI->elemsize;
  if (*(int *)(in_RDI + 0xd0) < 0) {
    local_57c = local_24 + *(int *)(in_RDI + 0xd0);
  }
  else {
    local_57c = *(int *)(in_RDI + 0xd0);
  }
  local_34 = local_57c;
  if (local_24 == 1) {
    local_38 = in_RSI->w;
    local_40 = Mat::operator_cast_to_float_(in_RSI);
    local_44 = -3.4028235e+38;
    for (local_48 = 0; local_48 < local_38; local_48 = local_48 + 1) {
      pfVar2 = std::max<float>(&local_44,local_40 + local_48);
      local_44 = *pfVar2;
    }
    local_4c = 0.0;
    for (local_50 = 0; local_50 < local_38; local_50 = local_50 + 1) {
      dVar3 = std::exp((double)(ulong)(uint)(local_40[local_50] - local_44));
      local_40[local_50] = SUB84(dVar3,0);
      local_4c = local_40[local_50] + local_4c;
    }
    for (local_54 = 0; local_54 < local_38; local_54 = local_54 + 1) {
      local_40[local_54] = local_40[local_54] / local_4c;
    }
    local_4 = 0;
  }
  else {
    local_18 = in_RSI;
    if ((local_24 == 2) && (local_57c == 0)) {
      local_58 = in_RSI->w;
      local_5c = in_RSI->h;
      Mat::Mat(&local_a8);
      Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                  (int)((ulong)in_stack_fffffffffffff948 >> 0x20),(size_t)in_stack_fffffffffffff940,
                  in_stack_fffffffffffff938);
      bVar1 = Mat::empty(in_stack_fffffffffffff930);
      if (bVar1) {
        local_4 = -100;
        local_b8 = 1;
      }
      else {
        Mat::fill(in_stack_fffffffffffff940,(float)((ulong)in_stack_fffffffffffff938 >> 0x20));
        for (local_bc = 0; _w = (int)((ulong)in_stack_fffffffffffff948 >> 0x20), local_bc < local_5c
            ; local_bc = local_bc + 1) {
          local_c8 = Mat::row(local_18,local_bc);
          for (local_cc = 0; local_cc < local_58; local_cc = local_cc + 1) {
            pfVar2 = Mat::operator[](&local_a8,(long)local_cc);
            pfVar2 = std::max<float>(pfVar2,local_c8 + local_cc);
            fVar4 = *pfVar2;
            pfVar2 = Mat::operator[](&local_a8,(long)local_cc);
            *pfVar2 = fVar4;
          }
        }
        Mat::Mat(&local_118);
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),_w,
                    (size_t)in_stack_fffffffffffff940,in_stack_fffffffffffff938);
        fVar4 = (float)((ulong)in_stack_fffffffffffff938 >> 0x20);
        bVar1 = Mat::empty(in_stack_fffffffffffff930);
        if (bVar1) {
          local_4 = -100;
        }
        else {
          Mat::fill(in_stack_fffffffffffff940,fVar4);
          for (local_11c = 0; local_11c < local_5c; local_11c = local_11c + 1) {
            local_128 = Mat::row(local_18,local_11c);
            for (local_12c = 0; local_12c < local_58; local_12c = local_12c + 1) {
              fVar4 = local_128[local_12c];
              pfVar2 = Mat::operator[](&local_a8,(long)local_12c);
              dVar3 = std::exp((double)(ulong)(uint)(fVar4 - *pfVar2));
              local_128[local_12c] = SUB84(dVar3,0);
              fVar4 = local_128[local_12c];
              pfVar2 = Mat::operator[](&local_118,(long)local_12c);
              *pfVar2 = fVar4 + *pfVar2;
            }
          }
          for (local_130 = 0; local_130 < local_5c; local_130 = local_130 + 1) {
            local_138 = Mat::row(local_18,local_130);
            for (local_13c = 0; local_13c < local_58; local_13c = local_13c + 1) {
              pfVar2 = Mat::operator[](&local_118,(long)local_13c);
              local_138[local_13c] = local_138[local_13c] / *pfVar2;
            }
          }
          local_4 = 0;
        }
        local_b8 = 1;
        Mat::~Mat((Mat *)0x520d41);
      }
      Mat::~Mat((Mat *)0x520d4e);
    }
    else if ((local_24 == 2) && (local_57c == 1)) {
      local_140 = in_RSI->w;
      local_144 = in_RSI->h;
      local_24 = 2;
      for (local_148 = 0; local_148 < local_144; local_148 = local_148 + 1) {
        local_150 = Mat::row(local_18,local_148);
        local_154 = -3.4028235e+38;
        for (local_158 = 0; local_158 < local_140; local_158 = local_158 + 1) {
          pfVar2 = std::max<float>(&local_154,local_150 + local_158);
          local_154 = *pfVar2;
        }
        local_15c = 0.0;
        for (local_160 = 0; local_160 < local_140; local_160 = local_160 + 1) {
          dVar3 = std::exp((double)(ulong)(uint)(local_150[local_160] - local_154));
          local_150[local_160] = SUB84(dVar3,0);
          local_15c = local_150[local_160] + local_15c;
        }
        for (local_164 = 0; local_164 < local_140; local_164 = local_164 + 1) {
          local_150[local_164] = local_150[local_164] / local_15c;
        }
      }
      local_4 = 0;
    }
    else if ((local_24 == 3) && (local_57c == 0)) {
      local_168 = in_RSI->w;
      local_16c = in_RSI->h;
      local_170 = in_RSI->c;
      local_174 = local_168 * local_16c;
      Mat::Mat(&local_1c0);
      Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                  (int)((ulong)in_stack_fffffffffffff948 >> 0x20),(int)in_stack_fffffffffffff948,
                  (size_t)in_stack_fffffffffffff940,in_stack_fffffffffffff938);
      bVar1 = Mat::empty(in_stack_fffffffffffff930);
      if (bVar1) {
        local_4 = -100;
        local_b8 = 1;
      }
      else {
        Mat::fill(in_stack_fffffffffffff940,(float)((ulong)in_stack_fffffffffffff938 >> 0x20));
        for (local_1c4 = 0; local_1c4 < local_170; local_1c4 = local_1c4 + 1) {
          Mat::channel(in_stack_fffffffffffff958,(int)in_stack_fffffffffffff954);
          pfVar2 = Mat::operator_cast_to_float_(&local_218);
          Mat::~Mat((Mat *)0x5210e8);
          local_1d0 = pfVar2;
          for (local_21c = 0; local_21c < local_174; local_21c = local_21c + 1) {
            pfVar2 = Mat::operator[](&local_1c0,(long)local_21c);
            pfVar2 = std::max<float>(pfVar2,local_1d0 + local_21c);
            fVar4 = *pfVar2;
            pfVar2 = Mat::operator[](&local_1c0,(long)local_21c);
            *pfVar2 = fVar4;
          }
        }
        Mat::Mat(&local_268);
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                    (int)((ulong)in_stack_fffffffffffff948 >> 0x20),(int)in_stack_fffffffffffff948,
                    (size_t)in_stack_fffffffffffff940,in_stack_fffffffffffff938);
        fVar4 = (float)((ulong)in_stack_fffffffffffff938 >> 0x20);
        bVar1 = Mat::empty(in_stack_fffffffffffff930);
        if (bVar1) {
          local_4 = -100;
        }
        else {
          Mat::fill(in_stack_fffffffffffff940,fVar4);
          for (local_26c = 0; local_26c < local_170; local_26c = local_26c + 1) {
            Mat::channel(in_stack_fffffffffffff958,(int)in_stack_fffffffffffff954);
            pfVar2 = Mat::operator_cast_to_float_(&local_2c0);
            Mat::~Mat((Mat *)0x521308);
            local_278 = pfVar2;
            for (local_2c4 = 0; local_2c4 < local_174; local_2c4 = local_2c4 + 1) {
              fVar4 = local_278[local_2c4];
              pfVar2 = Mat::operator[](&local_1c0,(long)local_2c4);
              dVar3 = std::exp((double)(ulong)(uint)(fVar4 - *pfVar2));
              local_278[local_2c4] = SUB84(dVar3,0);
              fVar4 = local_278[local_2c4];
              pfVar2 = Mat::operator[](&local_268,(long)local_2c4);
              *pfVar2 = fVar4 + *pfVar2;
            }
          }
          for (local_2c8 = 0; local_2c8 < local_170; local_2c8 = local_2c8 + 1) {
            Mat::channel(in_stack_fffffffffffff958,(int)in_stack_fffffffffffff954);
            pfVar2 = Mat::operator_cast_to_float_(&local_318);
            Mat::~Mat((Mat *)0x5214b6);
            local_2d0 = pfVar2;
            for (local_31c = 0; local_31c < local_174; local_31c = local_31c + 1) {
              pfVar2 = Mat::operator[](&local_268,(long)local_31c);
              local_2d0[local_31c] = local_2d0[local_31c] / *pfVar2;
            }
          }
          local_4 = 0;
        }
        local_b8 = 1;
        Mat::~Mat((Mat *)0x521595);
      }
      Mat::~Mat((Mat *)0x5215b3);
    }
    else if ((local_24 == 3) && (local_57c == 1)) {
      local_320 = in_RSI->w;
      local_324 = in_RSI->h;
      local_328 = in_RSI->c;
      Mat::Mat(&local_370);
      Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                  (int)((ulong)in_stack_fffffffffffff948 >> 0x20),(int)in_stack_fffffffffffff948,
                  (size_t)in_stack_fffffffffffff940,in_stack_fffffffffffff938);
      bVar1 = Mat::empty(in_stack_fffffffffffff930);
      if (bVar1) {
        local_4 = -100;
        local_b8 = 1;
      }
      else {
        Mat::fill(in_stack_fffffffffffff940,(float)((ulong)in_stack_fffffffffffff938 >> 0x20));
        for (local_374 = 0; local_374 < local_328; local_374 = local_374 + 1) {
          Mat::channel(in_stack_fffffffffffff958,(int)in_stack_fffffffffffff954);
          pfVar2 = Mat::operator_cast_to_float_(&local_3c8);
          Mat::~Mat((Mat *)0x521722);
          local_380 = pfVar2;
          local_3d0 = Mat::row(&local_370,local_374);
          for (local_3d4 = 0; local_3d4 < local_324; local_3d4 = local_3d4 + 1) {
            for (local_3d8 = 0; local_3d8 < local_320; local_3d8 = local_3d8 + 1) {
              pfVar2 = std::max<float>(local_3d0 + local_3d8,local_380 + local_3d8);
              local_3d0[local_3d8] = *pfVar2;
            }
            local_380 = local_380 + local_320;
          }
        }
        Mat::Mat(&local_420);
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                    (int)((ulong)in_stack_fffffffffffff948 >> 0x20),(int)in_stack_fffffffffffff948,
                    (size_t)in_stack_fffffffffffff940,in_stack_fffffffffffff938);
        fVar4 = (float)((ulong)in_stack_fffffffffffff938 >> 0x20);
        bVar1 = Mat::empty(in_stack_fffffffffffff930);
        if (bVar1) {
          local_4 = -100;
        }
        else {
          Mat::fill(in_stack_fffffffffffff940,fVar4);
          for (local_424 = 0; local_424 < local_328; local_424 = local_424 + 1) {
            Mat::channel(in_stack_fffffffffffff958,(int)in_stack_fffffffffffff954);
            pfVar2 = Mat::operator_cast_to_float_(&local_478);
            Mat::~Mat((Mat *)0x521968);
            local_430 = pfVar2;
            local_480 = Mat::row(&local_370,local_424);
            in_stack_fffffffffffff958 = (Mat *)Mat::row(&local_420,local_424);
            local_488 = in_stack_fffffffffffff958;
            for (local_48c = 0; local_48c < local_324; local_48c = local_48c + 1) {
              for (local_490 = 0; local_490 < local_320; local_490 = local_490 + 1) {
                dVar3 = std::exp((double)(ulong)(uint)(local_430[local_490] - local_480[local_490]))
                ;
                in_stack_fffffffffffff954 = SUB84(dVar3,0);
                local_430[local_490] = in_stack_fffffffffffff954;
                *(float *)((long)&local_488->data + (long)local_490 * 4) =
                     local_430[local_490] + *(float *)((long)&local_488->data + (long)local_490 * 4)
                ;
              }
              local_430 = local_430 + local_320;
            }
          }
          for (local_494 = 0; local_494 < local_328; local_494 = local_494 + 1) {
            Mat::channel(in_stack_fffffffffffff958,(int)in_stack_fffffffffffff954);
            pfVar2 = Mat::operator_cast_to_float_(&local_4e8);
            Mat::~Mat((Mat *)0x521b69);
            local_4a0 = pfVar2;
            local_4f0 = Mat::row(&local_420,local_494);
            for (local_4f4 = 0; local_4f4 < local_324; local_4f4 = local_4f4 + 1) {
              for (local_4f8 = 0; local_4f8 < local_320; local_4f8 = local_4f8 + 1) {
                local_4a0[local_4f8] = local_4a0[local_4f8] / local_4f0[local_4f8];
              }
              local_4a0 = local_4a0 + local_320;
            }
          }
          local_4 = 0;
        }
        local_b8 = 1;
        Mat::~Mat((Mat *)0x521cb3);
      }
      Mat::~Mat((Mat *)0x521cd1);
    }
    else if ((local_24 == 3) && (local_57c == 2)) {
      local_4fc = in_RSI->w;
      local_500 = in_RSI->h;
      local_504 = in_RSI->c;
      local_24 = 3;
      for (local_508 = 0; local_508 < local_504; local_508 = local_508 + 1) {
        this_00 = &local_558;
        Mat::channel(in_stack_fffffffffffff958,(int)in_stack_fffffffffffff954);
        pfVar2 = Mat::operator_cast_to_float_(this_00);
        Mat::~Mat((Mat *)0x521d98);
        local_510 = pfVar2;
        for (local_55c = 0; local_55c < local_500; local_55c = local_55c + 1) {
          local_560 = -3.4028235e+38;
          for (local_564 = 0; local_564 < local_4fc; local_564 = local_564 + 1) {
            pfVar2 = std::max<float>(&local_560,local_510 + local_564);
            local_560 = *pfVar2;
          }
          local_568 = 0.0;
          for (local_56c = 0; local_56c < local_4fc; local_56c = local_56c + 1) {
            dVar3 = std::exp((double)(ulong)(uint)(local_510[local_56c] - local_560));
            local_510[local_56c] = SUB84(dVar3,0);
            local_568 = local_510[local_56c] + local_568;
          }
          for (local_570 = 0; local_570 < local_4fc; local_570 = local_570 + 1) {
            local_510[local_570] = local_510[local_570] / local_568;
          }
          local_510 = local_510 + local_4fc;
        }
      }
      local_4 = 0;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int Softmax::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // value = exp( value - global max value )
    // sum all value
    // value = value / sum

    int dims = bottom_top_blob.dims;
    size_t elemsize = bottom_top_blob.elemsize;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        int w = bottom_top_blob.w;

        float* ptr = bottom_top_blob;

        float max = -FLT_MAX;
        for (int i = 0; i < w; i++)
        {
            max = std::max(max, ptr[i]);
        }

        float sum = 0.f;
        for (int i = 0; i < w; i++)
        {
            ptr[i] = static_cast<float>(exp(ptr[i] - max));
            sum += ptr[i];
        }

        for (int i = 0; i < w; i++)
        {
            ptr[i] /= sum;
        }

        return 0;
    }

    if (dims == 2 && positive_axis == 0)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        Mat max;
        max.create(w, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);

        for (int i = 0; i < h; i++)
        {
            const float* ptr = bottom_top_blob.row(i);
            for (int j = 0; j < w; j++)
            {
                max[j] = std::max(max[j], ptr[j]);
            }
        }

        Mat sum;
        sum.create(w, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);

        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            for (int j = 0; j < w; j++)
            {
                ptr[j] = static_cast<float>(exp(ptr[j] - max[j]));
                sum[j] += ptr[j];
            }
        }

        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            for (int j = 0; j < w; j++)
            {
                ptr[j] /= sum[j];
            }
        }

        return 0;
    }

    if (dims == 2 && positive_axis == 1)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float m = -FLT_MAX;
            for (int j = 0; j < w; j++)
            {
                m = std::max(m, ptr[j]);
            }

            float s = 0.f;
            for (int j = 0; j < w; j++)
            {
                ptr[j] = static_cast<float>(exp(ptr[j] - m));
                s += ptr[j];
            }

            for (int j = 0; j < w; j++)
            {
                ptr[j] /= s;
            }
        }

        return 0;
    }

    if (dims == 3 && positive_axis == 0)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        Mat max;
        max.create(w, h, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                max[i] = std::max(max[i], ptr[i]);
            }
        }

        Mat sum;
        sum.create(w, h, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                ptr[i] = static_cast<float>(exp(ptr[i] - max[i]));
                sum[i] += ptr[i];
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                ptr[i] /= sum[i];
            }
        }

        return 0;
    }

    if (dims == 3 && positive_axis == 1)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        Mat max;
        max.create(w, channels, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);
            float* maxptr = max.row(q);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    maxptr[j] = std::max(maxptr[j], ptr[j]);
                }

                ptr += w;
            }
        }

        Mat sum;
        sum.create(w, channels, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float* maxptr = max.row(q);
            float* sumptr = sum.row(q);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    ptr[j] = static_cast<float>(exp(ptr[j] - maxptr[j]));
                    sumptr[j] += ptr[j];
                }

                ptr += w;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float* sumptr = sum.row(q);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    ptr[j] /= sumptr[j];
                }

                ptr += w;
            }
        }

        return 0;
    }

    if (dims == 3 && positive_axis == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                float max = -FLT_MAX;
                for (int j = 0; j < w; j++)
                {
                    max = std::max(max, ptr[j]);
                }

                float sum = 0.f;
                for (int j = 0; j < w; j++)
                {
                    ptr[j] = static_cast<float>(exp(ptr[j] - max));
                    sum += ptr[j];
                }

                for (int j = 0; j < w; j++)
                {
                    ptr[j] /= sum;
                }

                ptr += w;
            }
        }

        return 0;
    }

    return 0;
}